

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generic.cpp
# Opt level: O0

void ac::core::cpu::conv3x3_8to8_generic(Image *src,Image *dst,float *kernels,float *biases)

{
  conv3x3_generic<float,float,8,8>(src,dst,kernels,biases);
  return;
}

Assistant:

void conv3x3_8to8_generic(const Image& src, Image& dst, const float* kernels, const float* biases)
    {
        conv3x3_generic<float, float, 8, 8>(src, dst, kernels, biases);
    }